

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_safety(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *pCVar3;
  bool bVar4;
  ROOM_INDEX_DATA *pRoomIndex;
  
  pRoomIndex = get_room_index(0);
  if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
    pRoomIndex = get_room_index(0);
  }
  pCVar2 = ch->in_room->people;
  while (pCVar3 = pCVar2, pCVar3 != (CHAR_DATA *)0x0) {
    pCVar2 = pCVar3->next_in_room;
    bVar4 = is_npc(pCVar3);
    if ((!bVar4) && (bVar4 = is_same_group(ch,pCVar3), bVar4)) {
      if ((((pCVar3->in_room->room_flags[0] & 0x2000) != 0) ||
          (bVar4 = is_affected_by(pCVar3,10), bVar4)) ||
         ((sVar1 = ch->in_room->cabal, sVar1 != 0 && (ch->cabal != sVar1)))) {
        send_to_char("Spell failed.\n\r",pCVar3);
      }
      else {
        act("$n suddenly vanishes!",pCVar3,(void *)0x0,(void *)0x0,0);
      }
    }
  }
  pCVar2 = ch->in_room->people;
  while (pCVar3 = pCVar2, pCVar3 != (CHAR_DATA *)0x0) {
    pCVar2 = pCVar3->next_in_room;
    bVar4 = is_same_group(ch,pCVar3);
    if (((bVar4) && ((pCVar3->in_room->room_flags[0] & 0x2000) == 0)) &&
       (bVar4 = is_affected_by(pCVar3,10), !bVar4)) {
      if (pCVar3->fighting != (CHAR_DATA *)0x0) {
        stop_fighting(pCVar3,true);
      }
      char_from_room(pCVar3);
      char_to_room(pCVar3,pRoomIndex);
      act("$n suddenly appears in the room.",pCVar3,(void *)0x0,(void *)0x0,0);
      do_look(pCVar3,"auto");
    }
  }
  ch->move = (short)((uint)(int)(short)(ch->move - (ch->move >> 0xf)) >> 1);
  return;
}

Assistant:

void spell_safety(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *gch;
	CHAR_DATA *gch_next;
	ROOM_INDEX_DATA *pRoomIndex;

	pRoomIndex = get_room_index(hometown_table[ch->hometown].recall);

	if (pRoomIndex == nullptr)
		pRoomIndex = get_room_index(ROOM_VNUM_TEMPLE);

	for (gch = ch->in_room->people; gch != nullptr; gch = gch_next)
	{
		gch_next = gch->next_in_room;

		if (is_npc(gch))
			continue;

		if (!is_same_group(ch, gch))
			continue;

		if (IS_SET(gch->in_room->room_flags, ROOM_NO_RECALL)
			|| is_affected_by(gch, AFF_CURSE)
			|| (ch->in_room->cabal != 0 && ch->cabal != ch->in_room->cabal))
		{
			send_to_char("Spell failed.\n\r", gch);
		}
		else
		{
			act("$n suddenly vanishes!", gch, 0, 0, TO_ROOM);
		}
	}

	for (gch = ch->in_room->people; gch != nullptr; gch = gch_next)
	{
		gch_next = gch->next_in_room;

		if (!is_same_group(ch, gch))
			continue;

		if (IS_SET(gch->in_room->room_flags, ROOM_NO_RECALL) || is_affected_by(gch, AFF_CURSE))
			continue;

		if (gch->fighting != nullptr)
			stop_fighting(gch, true);

		char_from_room(gch);
		char_to_room(gch, pRoomIndex);
		act("$n suddenly appears in the room.", gch, 0, 0, TO_ROOM);
		do_look(gch, "auto");
	}

	ch->move /= 2;
}